

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

void __thiscall capnp::schema::Value::Builder::adoptData(Builder *this,Orphan<capnp::Data> *value)

{
  PointerBuilder builder;
  uint uVar1;
  Orphan<capnp::Data> *value_00;
  PointerBuilder local_30;
  Orphan<capnp::Data> *local_18;
  Orphan<capnp::Data> *value_local;
  Builder *this_local;
  
  local_18 = value;
  value_local = (Orphan<capnp::Data> *)this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::schema::Value::Which>(&this->_builder,uVar1,DATA);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  value_00 = kj::mv<capnp::Orphan<capnp::Data>>(local_18);
  builder.capTable = local_30.capTable;
  builder.segment = local_30.segment;
  builder.pointer = local_30.pointer;
  capnp::_::PointerHelpers<capnp::Data,_(capnp::Kind)1>::adopt(builder,value_00);
  return;
}

Assistant:

inline void Value::Builder::adoptData(
    ::capnp::Orphan< ::capnp::Data>&& value) {
  _builder.setDataField<Value::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Value::DATA);
  ::capnp::_::PointerHelpers< ::capnp::Data>::adopt(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), kj::mv(value));
}